

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

InplaceStr GetTypeDefaultConstructorName(ExpressionContext *ctx,TypeClass *classType)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  ulong size;
  uint uVar3;
  InplaceStr IVar4;
  InplaceStr IVar5;
  
  IVar4 = GetTypeConstructorName(classType);
  uVar3 = (int)IVar4.end - (int)IVar4.begin;
  size = (ulong)(uVar3 + 2);
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,size);
  IVar5.begin = (char *)CONCAT44(extraout_var,iVar1);
  NULLC::SafeSprintf(IVar5.begin,size,"%.*s$",(ulong)uVar3,IVar4.begin);
  sVar2 = strlen(IVar5.begin);
  IVar5.end = IVar5.begin + sVar2;
  return IVar5;
}

Assistant:

InplaceStr GetTypeDefaultConstructorName(ExpressionContext &ctx, TypeClass *classType)
{
	InplaceStr baseName(GetTypeConstructorName(classType));

	unsigned length = baseName.length() + 2;
	char *name = (char*)ctx.allocator->alloc(length);
	NULLC::SafeSprintf(name, length, "%.*s$", FMT_ISTR(baseName));

	return InplaceStr(name);
}